

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ic.c
# Opt level: O0

int IDACalcIC(void *ida_mem,int icopt,sunrealtype tout1)

{
  int iVar1;
  N_Vector p_Var2;
  int in_ESI;
  IDAMem in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  IDAMem IDA_mem_00;
  IDAMem IDA_mem_01;
  IDAMem IDA_mem;
  sunrealtype ypnorm;
  sunrealtype hic;
  sunrealtype minid;
  sunrealtype troundoff;
  sunrealtype tdist;
  int retval;
  int icret;
  int mxnh;
  int nh;
  int nwt;
  int ier;
  int ewtsetOK;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  N_Vector in_stack_ffffffffffffff98;
  IDAMem in_stack_ffffffffffffffa8;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_3c = 0;
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x73,"IDACalcIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_MallocDone == 0) {
    IDAProcessError(in_RDI,-0x17,0x7e,"IDACalcIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"Attempt to call before IDAMalloc.");
    local_4 = -0x17;
  }
  else {
    iVar1 = IDAInitialSetup((IDAMem)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (iVar1 == 0) {
      in_RDI->ida_SetupDone = 1;
      if ((in_ESI == 1) || (in_ESI == 2)) {
        in_RDI->ida_icopt = in_ESI;
        if ((in_ESI == 1) && (in_RDI->ida_id == (N_Vector)0x0)) {
          IDAProcessError(in_RDI,-0x16,0x9b,"IDACalcIC",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                          ,"id = NULL conflicts with icopt.");
          local_4 = -0x16;
        }
        else {
          dVar3 = ABS(in_XMM0_Qa - in_RDI->ida_tn);
          if (in_RDI->ida_uround * 2.0 * (ABS(in_RDI->ida_tn) + ABS(in_XMM0_Qa)) <= dVar3) {
            p_Var2 = (N_Vector)N_VClone(in_RDI->ida_ee);
            in_RDI->ida_yy0 = p_Var2;
            p_Var2 = (N_Vector)N_VClone(in_RDI->ida_ee);
            in_RDI->ida_yp0 = p_Var2;
            in_RDI->ida_t0 = in_RDI->ida_tn;
            N_VScale(0x3ff0000000000000,in_RDI->ida_phi[0],in_RDI->ida_yy0);
            N_VScale(0x3ff0000000000000,in_RDI->ida_phi[1],in_RDI->ida_yp0);
            in_RDI->ida_sysindex = 1;
            in_RDI->ida_tscale = dVar3;
            if (in_ESI == 1) {
              in_stack_ffffffffffffffa8 = (IDAMem)N_VMin(in_RDI->ida_id);
              if ((double)in_stack_ffffffffffffffa8 < 0.0) {
                IDAProcessError(in_RDI,-0x16,0xbd,"IDACalcIC",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                                ,"id has illegal values.");
                return -0x16;
              }
              if (0.5 < (double)in_stack_ffffffffffffffa8) {
                in_RDI->ida_sysindex = 0;
              }
            }
            in_RDI->ida_epsNewt = in_RDI->ida_epiccon;
            in_RDI->ida_cjratio = 1.0;
            in_RDI->ida_nbacktr = 0;
            IDA_mem_00 = (IDAMem)(dVar3 * 0.001);
            IDA_mem_01 = (IDAMem)IDAWrmsNorm(IDA_mem_00,in_stack_ffffffffffffff98,(N_Vector)in_RDI,
                                             in_stack_ffffffffffffff8c);
            if (0.5 / (double)IDA_mem_00 < (double)IDA_mem_01) {
              IDA_mem_00 = (IDAMem)(0.5 / (double)IDA_mem_01);
            }
            if (in_XMM0_Qa < in_RDI->ida_tn) {
              IDA_mem_00 = (IDAMem)((ulong)IDA_mem_00 ^ 0x8000000000000000);
            }
            in_RDI->ida_hh = (sunrealtype)IDA_mem_00;
            if (in_ESI == 1) {
              in_RDI->ida_cj = 1.0 / (double)IDA_mem_00;
              local_34 = in_RDI->ida_maxnh;
            }
            else {
              in_RDI->ida_cj = 0.0;
              local_34 = 1;
            }
            for (local_2c = 1; local_2c < 3; local_2c = local_2c + 1) {
              for (local_30 = 1;
                  (((local_30 <= local_34 &&
                    (local_3c = IDAnlsIC(in_stack_ffffffffffffffa8), local_3c != 0)) &&
                   (in_RDI->ida_ncfn = in_RDI->ida_ncfn + 1, -1 < local_3c)) &&
                  (local_30 != local_34)); local_30 = local_30 + 1) {
                if (local_3c != 5) {
                  N_VScale(0x3ff0000000000000,in_RDI->ida_phi[0],in_RDI->ida_yy0);
                  N_VScale(0x3ff0000000000000,in_RDI->ida_phi[1],in_RDI->ida_yp0);
                }
                IDA_mem_00 = (IDAMem)((double)IDA_mem_00 * 0.1);
                in_RDI->ida_cj = 1.0 / (double)IDA_mem_00;
                in_RDI->ida_hh = (sunrealtype)IDA_mem_00;
              }
              if (local_3c != 0) break;
              iVar1 = (*in_RDI->ida_efun)(in_RDI->ida_yy0,in_RDI->ida_ewt,in_RDI->ida_edata);
              if (iVar1 != 0) {
                local_3c = -0x18;
                break;
              }
              N_VScale(0x3ff0000000000000,in_RDI->ida_yy0,in_RDI->ida_phi[0]);
              N_VScale(0x3ff0000000000000,in_RDI->ida_yp0,in_RDI->ida_phi[1]);
            }
            N_VDestroy(in_RDI->ida_yy0);
            N_VDestroy(in_RDI->ida_yp0);
            if (in_ESI == 1) {
              in_RDI->ida_hused = (sunrealtype)IDA_mem_00;
            }
            if (local_3c == 0) {
              local_4 = 0;
            }
            else {
              local_4 = IDAICFailFlag(IDA_mem_01,(int)((ulong)in_RDI >> 0x20));
            }
          }
          else {
            IDAProcessError(in_RDI,-0x16,0xa6,"IDACalcIC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                            ,"tout1 too close to t0 to attempt initial condition calculation.");
            local_4 = -0x16;
          }
        }
      }
      else {
        IDAProcessError(in_RDI,-0x16,0x92,"IDACalcIC",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                        ,"icopt has an illegal value.");
        local_4 = -0x16;
      }
    }
    else {
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDACalcIC(void* ida_mem, int icopt, sunrealtype tout1)
{
  int ewtsetOK;
  int ier, nwt, nh, mxnh, icret, retval = 0;
  sunrealtype tdist, troundoff, minid, hic, ypnorm;
  IDAMem IDA_mem;

  /* Check if IDA memory exists */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if problem was malloc'ed */

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_MALLOC);
  }

  /* Check inputs to IDA for correctness and consistency */

  ier = IDAInitialSetup(IDA_mem);
  if (ier != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  IDA_mem->ida_SetupDone = SUNTRUE;

  /* Check legality of input arguments, and set IDA memory copies. */

  if (icopt != IDA_YA_YDP_INIT && icopt != IDA_Y_INIT)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_BAD_ICOPT);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  IDA_mem->ida_icopt = icopt;

  if (icopt == IDA_YA_YDP_INIT && (IDA_mem->ida_id == NULL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_MISSING_ID);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  tdist     = SUNRabs(tout1 - IDA_mem->ida_tn);
  troundoff = TWO * IDA_mem->ida_uround *
              (SUNRabs(IDA_mem->ida_tn) + SUNRabs(tout1));
  if (tdist < troundoff)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_TOO_CLOSE);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Allocate space and initialize temporary vectors */

  IDA_mem->ida_yy0 = N_VClone(IDA_mem->ida_ee);
  IDA_mem->ida_yp0 = N_VClone(IDA_mem->ida_ee);
  IDA_mem->ida_t0  = IDA_mem->ida_tn;
  N_VScale(ONE, IDA_mem->ida_phi[0], IDA_mem->ida_yy0);
  N_VScale(ONE, IDA_mem->ida_phi[1], IDA_mem->ida_yp0);

  /* For use in the IDA_YA_YP_INIT case, set sysindex and tscale. */

  IDA_mem->ida_sysindex = 1;
  IDA_mem->ida_tscale   = tdist;
  if (icopt == IDA_YA_YDP_INIT)
  {
    minid = N_VMin(IDA_mem->ida_id);
    if (minid < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_IC_BAD_ID);
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_ILL_INPUT);
    }
    if (minid > HALF) { IDA_mem->ida_sysindex = 0; }
  }

  /* Set the test constant in the Newton convergence test */

  IDA_mem->ida_epsNewt = IDA_mem->ida_epiccon;

  /* Initializations:
     cjratio = 1 (for use in direct linear solvers);
     set nbacktr = 0; */

  IDA_mem->ida_cjratio = ONE;
  IDA_mem->ida_nbacktr = 0;

  /* Set hic, hh, cj, and mxnh. */

  hic    = PT001 * tdist;
  ypnorm = IDAWrmsNorm(IDA_mem, IDA_mem->ida_yp0, IDA_mem->ida_ewt,
                       IDA_mem->ida_suppressalg);
  if (ypnorm > HALF / hic) { hic = HALF / ypnorm; }
  if (tout1 < IDA_mem->ida_tn) { hic = -hic; }
  IDA_mem->ida_hh = hic;
  if (icopt == IDA_YA_YDP_INIT)
  {
    IDA_mem->ida_cj = ONE / hic;
    mxnh            = IDA_mem->ida_maxnh;
  }
  else
  {
    IDA_mem->ida_cj = ZERO;
    mxnh            = 1;
  }

  /* Loop over nwt = number of evaluations of ewt vector. */

  for (nwt = 1; nwt <= 2; nwt++)
  {
    /* Loop over nh = number of h values. */
    for (nh = 1; nh <= mxnh; nh++)
    {
      /* Call the IC nonlinear solver function. */
      retval = IDAnlsIC(IDA_mem);

      /* Cut h and loop on recoverable IDA_YA_YDP_INIT failure; else break. */
      if (retval == IDA_SUCCESS) { break; }
      IDA_mem->ida_ncfn++;
      if (retval < 0) { break; }
      if (nh == mxnh) { break; }
      /* If looping to try again, reset yy0 and yp0 if not converging. */
      if (retval != IC_SLOW_CONVRG)
      {
        N_VScale(ONE, IDA_mem->ida_phi[0], IDA_mem->ida_yy0);
        N_VScale(ONE, IDA_mem->ida_phi[1], IDA_mem->ida_yp0);
      }
      hic *= PT1;
      IDA_mem->ida_cj = ONE / hic;
      IDA_mem->ida_hh = hic;
    } /* End of nh loop */

    /* Break on failure; else reset ewt, save yy0, yp0 in phi, and loop. */
    if (retval != IDA_SUCCESS) { break; }
    ewtsetOK = IDA_mem->ida_efun(IDA_mem->ida_yy0, IDA_mem->ida_ewt,
                                 IDA_mem->ida_edata);
    if (ewtsetOK != 0)
    {
      retval = IDA_BAD_EWT;
      break;
    }
    N_VScale(ONE, IDA_mem->ida_yy0, IDA_mem->ida_phi[0]);
    N_VScale(ONE, IDA_mem->ida_yp0, IDA_mem->ida_phi[1]);

  } /* End of nwt loop */

  /* Free temporary space */

  N_VDestroy(IDA_mem->ida_yy0);
  N_VDestroy(IDA_mem->ida_yp0);

  /* Load the optional outputs. */

  if (icopt == IDA_YA_YDP_INIT) { IDA_mem->ida_hused = hic; }

  /* On any failure, print message and return proper flag. */

  if (retval != IDA_SUCCESS)
  {
    icret = IDAICFailFlag(IDA_mem, retval);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (icret);
  }

  /* Otherwise return success flag. */

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}